

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

string * __thiscall
cmsys::SystemInformation::GetMemoryDescription_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this,char *hostLimitEnvVarName,
          char *procLimitEnvVarName)

{
  SystemInformationImplementation *pSVar1;
  ostream *poVar2;
  SystemInformationImplementation *pSVar3;
  longlong values [1];
  char *fieldNames [2];
  ostringstream oss;
  longlong local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Host Total: ",0xc);
  local_1a8 = "MemTotal:";
  local_1a0 = 0;
  local_1b0 = 0;
  anon_unknown_3::GetFieldsFromFile<long_long>("/proc/meminfo",&local_1a8,&local_1b0);
  pSVar1 = (SystemInformationImplementation *)
           std::ostream::_M_insert<long_long>((longlong)local_198);
  pSVar3 = pSVar1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pSVar1," KiB, Host Available: ",0x16);
  SystemInformationImplementation::GetHostMemoryAvailable(pSVar3,hostLimitEnvVarName);
  pSVar1 = (SystemInformationImplementation *)std::ostream::_M_insert<long_long>((longlong)pSVar1);
  pSVar3 = pSVar1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pSVar1," KiB, Process Available: ",0x19);
  SystemInformationImplementation::GetProcMemoryAvailable
            (pSVar3,hostLimitEnvVarName,procLimitEnvVarName);
  poVar2 = std::ostream::_M_insert<long_long>((longlong)pSVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," KiB",4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetMemoryDescription(
  const char* hostLimitEnvVarName, const char* procLimitEnvVarName)
{
  std::ostringstream oss;
  oss << "Host Total: " << this->GetHostMemoryTotal()
      << " KiB, Host Available: "
      << this->GetHostMemoryAvailable(hostLimitEnvVarName)
      << " KiB, Process Available: "
      << this->GetProcMemoryAvailable(hostLimitEnvVarName, procLimitEnvVarName)
      << " KiB";
  return oss.str();
}